

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<Fad<double>_> * __thiscall
Fad<Fad<double>>::operator=
          (Fad<Fad<double>> *this,
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>_>_>
          *fadexpr)

{
  Fad<Fad<double>_> *pFVar1;
  bool bVar2;
  uint ssize;
  double *pdVar3;
  ulong uVar4;
  value_type local_58;
  Fad<Fad<double>_> *local_38;
  
  ssize = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>_>
          ::size(&fadexpr->fadexpr_);
  if (ssize != *(uint *)(this + 0x28)) {
    Vector<Fad<double>_>::resize((Vector<Fad<double>_> *)(this + 0x28),ssize);
  }
  local_38 = (Fad<Fad<double>_> *)this;
  if (ssize != 0) {
    pdVar3 = *(double **)(this + 0x30);
    bVar2 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>_>
            ::hasFastAccess(&fadexpr->fadexpr_);
    if (bVar2) {
      if (0 < (int)ssize) {
        uVar4 = 0;
        do {
          FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>_>
          ::fastAccessDx(&local_58,&fadexpr->fadexpr_,(int)uVar4);
          *pdVar3 = local_58.val_;
          Vector<double>::operator=((Vector<double> *)(pdVar3 + 1),&local_58.dx_);
          pdVar3[3] = local_58.defaultVal;
          Fad<double>::~Fad(&local_58);
          uVar4 = uVar4 + 1;
          pdVar3 = pdVar3 + 4;
        } while (ssize != uVar4);
      }
    }
    else if (0 < (int)ssize) {
      uVar4 = 0;
      do {
        FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>_>
        ::dx(&local_58,&fadexpr->fadexpr_,(int)uVar4);
        *pdVar3 = local_58.val_;
        Vector<double>::operator=((Vector<double> *)(pdVar3 + 1),&local_58.dx_);
        pdVar3[3] = local_58.defaultVal;
        Fad<double>::~Fad(&local_58);
        uVar4 = uVar4 + 1;
        pdVar3 = pdVar3 + 4;
      } while (ssize != uVar4);
    }
  }
  FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>_>
  ::val(&local_58,&fadexpr->fadexpr_);
  pFVar1 = local_38;
  (local_38->val_).val_ = local_58.val_;
  Vector<double>::operator=(&(local_38->val_).dx_,&local_58.dx_);
  (pFVar1->val_).defaultVal = local_58.defaultVal;
  Fad<double>::~Fad(&local_58);
  return pFVar1;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}